

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval.hh
# Opt level: O0

string * __thiscall
tinyusdz::tydra::TerminalAttributeValue::type_name_abi_cxx11_
          (string *__return_storage_ptr__,TerminalAttributeValue *this)

{
  TerminalAttributeValue *this_local;
  
  if ((this->_empty & 1U) == 0) {
    tinyusdz::value::Value::type_name_abi_cxx11_(__return_storage_ptr__,&this->_value);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_type_name);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string type_name() const {
    if (_empty) {
      return _type_name;
    }

    return _value.type_name();
  }